

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O2

void UI::PathTracerControlButtons
               (shared_ptr<PathTracerThread> *path_tracer_thread,char **open_modal)

{
  bool bVar1;
  char *text;
  
  bVar1 = ImGui::MenuItem(anon_var_dwarf_1f2fbf,(char *)0x0,false,true);
  if (bVar1) {
    *open_modal = "Export OpenEXR";
  }
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Export OpenEXR",(char *)0x0);
    ImGui::EndTooltip();
  }
  bVar1 = ImGui::MenuItem(anon_var_dwarf_1f2fdf,(char *)0x0,false,true);
  if (bVar1) {
    *open_modal = "Stop PathTracer";
  }
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Stop Path Tracer",(char *)0x0);
    ImGui::EndTooltip();
  }
  if (((((path_tracer_thread->super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->m_pause)._M_base._M_i & 1U) == 0) {
    bVar1 = ImGui::MenuItem(anon_var_dwarf_1f301f,(char *)0x0,false,true);
    if (bVar1) {
      PathTracerThread::SetPause
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,true);
    }
    bVar1 = ImGui::IsItemHovered(0);
    if (!bVar1) {
      return;
    }
    text = "Pause Path Tracer";
  }
  else {
    bVar1 = ImGui::MenuItem(anon_var_dwarf_1f19d7,(char *)0x0,false,true);
    if (bVar1) {
      PathTracerThread::SetPause
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,false);
    }
    bVar1 = ImGui::IsItemHovered(0);
    if (!bVar1) {
      return;
    }
    text = "Resume Path Tracer";
  }
  ImGui::BeginTooltip();
  ImGui::TextUnformatted(text,(char *)0x0);
  ImGui::EndTooltip();
  return;
}

Assistant:

void PathTracerControlButtons(const std::shared_ptr<PathTracerThread> &path_tracer_thread, const char **open_modal) {
	if (ImGui::MenuItem(ICON_FA_FILE_EXPORT)) {
		*open_modal = kPathTracerExportEXRModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Export OpenEXR");
		ImGui::EndTooltip();
	}

	if (ImGui::MenuItem(ICON_FA_STOP)) {
		*open_modal = kPathTracerStopModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Stop Path Tracer");
		ImGui::EndTooltip();
	}

	if (path_tracer_thread->IsPause()) {
		if (ImGui::MenuItem(ICON_FA_PLAY)) {
			path_tracer_thread->SetPause(false);
		}
		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Resume Path Tracer");
			ImGui::EndTooltip();
		}
	} else {
		if (ImGui::MenuItem(ICON_FA_PAUSE)) {
			path_tracer_thread->SetPause(true);
		}
		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Pause Path Tracer");
			ImGui::EndTooltip();
		}
	}
}